

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedSwitchProgramsCS::Run(AdvancedSwitchProgramsCS *this)

{
  bool bVar1;
  GLuint GVar2;
  uint *puVar3;
  GLuint expected [4];
  GLuint *out_data;
  undefined1 local_a8 [4];
  int i_1;
  GLubyte data [16];
  GLubyte data3 [16];
  GLubyte data2 [16];
  GLubyte data1 [16];
  GLubyte data0 [16];
  string local_40;
  int local_1c;
  AdvancedSwitchProgramsCS *pAStack_18;
  int i;
  AdvancedSwitchProgramsCS *this_local;
  
  local_1c = 0;
  pAStack_18 = this;
  while( true ) {
    if (3 < local_1c) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,this->m_storage_buffer);
      data1[8] = '\0';
      data1[9] = '\0';
      data1[10] = '\0';
      data1[0xb] = '\x11';
      data1[0xc] = '\0';
      data1[0xd] = '\0';
      data1[0xe] = '\0';
      data1[0xf] = 'D';
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,data1 + 8,0x88e4);
      data2[8] = '\0';
      data2[9] = '\0';
      data2[10] = 'D';
      data2[0xb] = '\0';
      data2[0xc] = '\0';
      data2[0xd] = '\0';
      data2[0xe] = '\"';
      data2[0xf] = '\0';
      data1[0] = '\0';
      data1[1] = '\0';
      data1[2] = 0x88;
      data1[3] = '\0';
      data1[4] = '\0';
      data1[5] = '\0';
      data1[6] = '\x11';
      data1[7] = '\0';
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,data2 + 8,0x88e4);
      data3[8] = '\0';
      data3[9] = 0x88;
      data3[10] = '\0';
      data3[0xb] = '\0';
      data3[0xc] = '\0';
      data3[0xd] = '\x11';
      data3[0xe] = '\0';
      data3[0xf] = '\0';
      data2[0] = '\0';
      data2[1] = 'D';
      data2[2] = '\0';
      data2[3] = '\0';
      data2[4] = '\0';
      data2[5] = '\"';
      data2[6] = '\0';
      data2[7] = '\0';
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,3,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,data3 + 8,0x88e4);
      data[8] = '\"';
      data[9] = '\0';
      data[10] = '\0';
      data[0xb] = '\0';
      data[0xc] = 0x88;
      data[0xd] = '\0';
      data[0xe] = '\0';
      data[0xf] = '\0';
      data3[0] = '\x11';
      data3[1] = '\0';
      data3[2] = '\0';
      data3[3] = '\0';
      data3[4] = 'D';
      data3[5] = '\0';
      data3[6] = '\0';
      data3[7] = '\0';
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,4,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,data + 8,0x88e4);
      memset(local_a8,0,0x10);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,local_a8,0x88e4);
      for (out_data._4_4_ = 0; out_data._4_4_ < 4; out_data._4_4_ = out_data._4_4_ + 1) {
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program[out_data._4_4_]);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      puVar3 = (uint *)glu::CallLogWrapper::glMapBufferRange
                                 (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                   super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
      if (puVar3 == (uint *)0x0) {
        this_local = (AdvancedSwitchProgramsCS *)&DAT_ffffffffffffffff;
      }
      else if ((((*puVar3 == 0xff000000) && (puVar3[1] == 0xff0000)) && (puVar3[2] == 0xff00)) &&
              (puVar3[3] == 0xff)) {
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        this_local = (AdvancedSwitchProgramsCS *)0x0;
      }
      else {
        anon_unknown_0::Output
                  ("Received: %x, %x, %x, %x, but expected: %x, %x, %x, %x\n",(ulong)*puVar3,
                   (ulong)puVar3[1],(ulong)puVar3[2],(ulong)puVar3[3],0xff000000,0xff0000,0xff00,
                   0xff);
        this_local = (AdvancedSwitchProgramsCS *)&DAT_ffffffffffffffff;
      }
      return (long)this_local;
    }
    gl4cts::(anonymous_namespace)::AdvancedSwitchProgramsCS::GenSource_abi_cxx11_
              (&local_40,this,local_1c + 1);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_40);
    this->m_program[local_1c] = GVar2;
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[local_1c]);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program[local_1c]);
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  return (long)&DAT_ffffffffffffffff;
}

Assistant:

virtual long Run()
	{
		for (int i = 0; i < 4; ++i)
		{
			m_program[i] = CreateProgramCS(GenSource(i + 1));
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(5, m_storage_buffer);

		const GLubyte data0[] = { 0, 0, 0, 0x11, 0, 0, 0, 0x44, 0, 0, 0, 0x88, 0, 0, 0, 0x22 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data0), data0, GL_STATIC_DRAW);
		const GLubyte data1[] = { 0, 0, 0x44, 0, 0, 0, 0x22, 0, 0, 0, 0x88, 0, 0, 0, 0x11, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data1), data1, GL_STATIC_DRAW);
		const GLubyte data2[] = { 0, 0x88, 0, 0, 0, 0x11, 0, 0, 0, 0x44, 0, 0, 0, 0x22, 0, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data2), data2, GL_STATIC_DRAW);
		const GLubyte data3[] = { 0x22, 0, 0, 0, 0x88, 0, 0, 0, 0x11, 0, 0, 0, 0x44, 0, 0, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data3), data3, GL_STATIC_DRAW);

		const GLubyte data[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		for (int i = 0; i < 4; ++i)
		{
			glUseProgram(m_program[i]);
			glDispatchCompute(1, 1, 1);
		}
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLuint* out_data = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data0), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		GLuint expected[4] = { 0xff000000, 0x00ff0000, 0x0000ff00, 0x000000ff };
		if (out_data[0] != expected[0] || out_data[1] != expected[1] || out_data[2] != expected[2] ||
			out_data[3] != expected[3])
		{
			Output("Received: %x, %x, %x, %x, but expected: %x, %x, %x, %x\n", out_data[0], out_data[1], out_data[2],
				   out_data[3], expected[0], expected[1], expected[2], expected[3]);
			return ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		return NO_ERROR;
	}